

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5ExprNode *
sqlite3Fts5ParseNode
          (Fts5Parse *pParse,int eType,Fts5ExprNode *pLeft,Fts5ExprNode *pRight,
          Fts5ExprNearset *pNear)

{
  Fts5ExprPhrase *pFVar1;
  int iVar2;
  Fts5ExprNode *p;
  code *pcVar3;
  long lVar4;
  char *pcVar5;
  Fts5ExprNearset *pNear_1;
  
  if (pParse->rc != 0) {
LAB_001bd42d:
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
    sqlite3Fts5ParseNearsetFree(pNear);
    return (Fts5ExprNode *)0x0;
  }
  if (eType == 9 && pNear == (Fts5ExprNearset *)0x0) {
    return (Fts5ExprNode *)0x0;
  }
  if (eType != 9 && pLeft == (Fts5ExprNode *)0x0) {
    return pRight;
  }
  if (eType != 9 && pRight == (Fts5ExprNode *)0x0) {
    return pLeft;
  }
  iVar2 = 2;
  if ((eType != 3) && (iVar2 = 0, eType - 1U < 2)) {
    iVar2 = 2;
    if (pLeft->eType == eType) {
      iVar2 = pLeft->nChild + 1;
    }
    if (pRight->eType == eType) {
      iVar2 = iVar2 + pRight->nChild + -1;
    }
  }
  p = (Fts5ExprNode *)sqlite3Fts5MallocZero(&pParse->rc,(long)iVar2 * 8 + 0x30);
  if (p == (Fts5ExprNode *)0x0) goto LAB_001bd42d;
  p->eType = eType;
  p->pNear = pNear;
  if (eType == 1) {
    pcVar3 = fts5ExprNodeNext_OR;
  }
  else {
    if (eType != 2) {
      if (eType == 9) {
        pcVar3 = fts5ExprNodeNext_STRING;
        if ((((pNear->nPhrase == 1) && (pFVar1 = pNear->apPhrase[0], pFVar1->nTerm == 1)) &&
            (pFVar1->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0)) && (pFVar1->aTerm[0].bFirst == '\0')
           ) {
          p->eType = 4;
          pcVar3 = fts5ExprNodeNext_TERM;
        }
        p->xNext = pcVar3;
      }
      else {
        p->xNext = fts5ExprNodeNext_NOT;
        if (eType != 9) goto LAB_001bd54c;
      }
      iVar2 = pNear->nPhrase;
      if (0 < (long)iVar2) {
        lVar4 = 0;
        do {
          pNear->apPhrase[lVar4]->pNode = p;
          if (pNear->apPhrase[lVar4]->nTerm == 0) {
            p->xNext = (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0;
            p->eType = 0;
          }
          lVar4 = lVar4 + 1;
        } while (iVar2 != lVar4);
      }
      if (pParse->pConfig->eDetail == 0) {
        return p;
      }
      if (iVar2 == 1) {
        pcVar5 = "phrase";
        iVar2 = pNear->apPhrase[0]->nTerm;
        if (iVar2 < 2) {
          if (iVar2 != 1) {
            return p;
          }
          if (pNear->apPhrase[0]->aTerm[0].bFirst == '\0') {
            return p;
          }
        }
      }
      else {
        pcVar5 = "NEAR";
      }
      pParse->rc = 1;
      pcVar5 = sqlite3_mprintf("fts5: %s queries are not supported (detail!=full)",pcVar5);
      pParse->zErr = pcVar5;
      sqlite3_free(p);
      goto LAB_001bd42d;
    }
    pcVar3 = fts5ExprNodeNext_AND;
  }
  p->xNext = pcVar3;
LAB_001bd54c:
  fts5ExprAddChildren(p,pLeft);
  fts5ExprAddChildren(p,pRight);
  return p;
}

Assistant:

static Fts5ExprNode *sqlite3Fts5ParseNode(
  Fts5Parse *pParse,              /* Parse context */
  int eType,                      /* FTS5_STRING, AND, OR or NOT */
  Fts5ExprNode *pLeft,            /* Left hand child expression */
  Fts5ExprNode *pRight,           /* Right hand child expression */
  Fts5ExprNearset *pNear          /* For STRING expressions, the near cluster */
){
  Fts5ExprNode *pRet = 0;

  if( pParse->rc==SQLITE_OK ){
    int nChild = 0;               /* Number of children of returned node */
    sqlite3_int64 nByte;          /* Bytes of space to allocate for this node */
 
    assert( (eType!=FTS5_STRING && !pNear)
         || (eType==FTS5_STRING && !pLeft && !pRight)
    );
    if( eType==FTS5_STRING && pNear==0 ) return 0;
    if( eType!=FTS5_STRING && pLeft==0 ) return pRight;
    if( eType!=FTS5_STRING && pRight==0 ) return pLeft;

    if( eType==FTS5_NOT ){
      nChild = 2;
    }else if( eType==FTS5_AND || eType==FTS5_OR ){
      nChild = 2;
      if( pLeft->eType==eType ) nChild += pLeft->nChild-1;
      if( pRight->eType==eType ) nChild += pRight->nChild-1;
    }

    nByte = sizeof(Fts5ExprNode) + sizeof(Fts5ExprNode*)*(nChild-1);
    pRet = (Fts5ExprNode*)sqlite3Fts5MallocZero(&pParse->rc, nByte);

    if( pRet ){
      pRet->eType = eType;
      pRet->pNear = pNear;
      fts5ExprAssignXNext(pRet);
      if( eType==FTS5_STRING ){
        int iPhrase;
        for(iPhrase=0; iPhrase<pNear->nPhrase; iPhrase++){
          pNear->apPhrase[iPhrase]->pNode = pRet;
          if( pNear->apPhrase[iPhrase]->nTerm==0 ){
            pRet->xNext = 0;
            pRet->eType = FTS5_EOF;
          }
        }

        if( pParse->pConfig->eDetail!=FTS5_DETAIL_FULL ){
          Fts5ExprPhrase *pPhrase = pNear->apPhrase[0];
          if( pNear->nPhrase!=1 
           || pPhrase->nTerm>1
           || (pPhrase->nTerm>0 && pPhrase->aTerm[0].bFirst)
          ){
            assert( pParse->rc==SQLITE_OK );
            pParse->rc = SQLITE_ERROR;
            assert( pParse->zErr==0 );
            pParse->zErr = sqlite3_mprintf(
                "fts5: %s queries are not supported (detail!=full)", 
                pNear->nPhrase==1 ? "phrase": "NEAR"
                );
            sqlite3_free(pRet);
            pRet = 0;
          }
        }
      }else{
        fts5ExprAddChildren(pRet, pLeft);
        fts5ExprAddChildren(pRet, pRight);
      }
    }
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
    sqlite3Fts5ParseNearsetFree(pNear);
  }
  return pRet;
}